

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hh
# Opt level: O1

void __thiscall
tchecker::
size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::declare(size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,uint id,string *name,clock_info_t *info)

{
  uint uVar1;
  invalid_argument *this_00;
  
  if (id < this->_next_id) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Variable identifier is already used");
  }
  else {
    uVar1 = (info->super_size_info_t)._size;
    if (!CARRY4(uVar1,id)) {
      variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::declare(&this->
                 super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,id,name,info);
      if ((id < this->_first_id) || (this->_first_id == this->_next_id)) {
        this->_first_id = id;
      }
      this->_next_id = uVar1 + id;
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Not enough variable identifiers left");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void declare(ID id, std::string const & name, INFO const & info)
  {
    if (id < _next_id)
      throw std::invalid_argument("Variable identifier is already used");

    typename INFO::size_t size = info.size();

    if (id + size < id) // overflow
      throw std::invalid_argument("Not enough variable identifiers left");

    tchecker::variables_t<ID, INFO, INDEX>::declare(id, name, info);
    if ((id < _first_id) || (_first_id == _next_id))
      _first_id = id;
    _next_id = id + size;
  }